

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

z_uLong z_crc32(uint crc,uchar *buf,uint len)

{
  ulong uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  if (buf == (uchar *)0x0) {
    return 0;
  }
  uVar5 = ~crc;
  if (((ulong)buf & 3) != 0 && len != 0) {
    puVar3 = buf + 1;
    uVar4 = len;
    do {
      uVar2 = *(uint *)buf;
      buf = (uchar *)((long)buf + 1);
      uVar5 = uVar5 >> 8 ^ crc_table[0][(byte)((byte)uVar2 ^ (byte)uVar5)];
      len = uVar4 - 1;
      if (uVar4 == 1) break;
      uVar1 = (ulong)puVar3 & 3;
      puVar3 = puVar3 + 1;
      uVar4 = len;
    } while (uVar1 != 0);
  }
  for (; 0x1f < len; len = len - 0x20) {
    uVar5 = uVar5 ^ *(uint *)buf;
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 4);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 8);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 0xc);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 0x10);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 0x14);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 0x18);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18] ^ *(uint *)((long)buf + 0x1c);
    buf = (uchar *)((long)buf + 0x20);
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18];
  }
  for (; 3 < len; len = len - 4) {
    uVar5 = uVar5 ^ *(uint *)buf;
    uVar5 = crc_table[2][uVar5 >> 8 & 0xff] ^ crc_table[3][uVar5 & 0xff] ^
            *(uint *)((long)crc_table[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
            crc_table[0][uVar5 >> 0x18];
    buf = (uchar *)((long)buf + 4);
  }
  if (len != 0) {
    lVar6 = 0;
    do {
      uVar5 = uVar5 >> 8 ^ crc_table[0][(byte)(*(byte *)((long)buf + lVar6) ^ (byte)uVar5)];
      lVar6 = lVar6 + 1;
    } while (len != (uint)lVar6);
  }
  return ~uVar5;
}

Assistant:

unsigned int ZEXPORT crc32(crc, buf, len)
    unsigned int crc;
    const unsigned char FAR *buf;
    unsigned len;
{
    if (buf == Z_NULL) return 0UL;

#ifdef DYNAMIC_CRC_TABLE
    if (crc_table_empty)
        make_crc_table();
#endif /* DYNAMIC_CRC_TABLE */

#ifdef BYFOUR
    if (sizeof(void *) == sizeof(ptrdiff_t)) {
        u4 endian;

        endian = 1;
        if (*((unsigned char *)(&endian)))
            return crc32_little(crc, buf, len);
        else
            return crc32_big(crc, buf, len);
    }
#endif /* BYFOUR */
    crc = crc ^ 0xffffffffUL;
    while (len >= 8) {
        DO8;
        len -= 8;
    }
    if (len) do {
        DO1;
    } while (--len);
    return crc ^ 0xffffffffUL;
}